

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_cms_get_metric_statistics.cc
# Opt level: O2

int __thiscall
aliyun::Cms::GetMetricStatistics
          (Cms *this,CmsGetMetricStatisticsRequestType *req,
          CmsGetMetricStatisticsResponseType *response,CmsErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  Int IVar3;
  ArrayIndex AVar4;
  AliRpcRequest *this_00;
  Value *pVVar5;
  Value *this_01;
  uint index;
  char *pcVar6;
  Value val;
  allocator<char> local_4ec;
  allocator<char> local_4eb;
  allocator<char> local_4ea;
  allocator<char> local_4e9;
  string local_4e8;
  CmsGetMetricStatisticsResponseType *local_4c8;
  value_type local_4c0;
  string str_response;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar6 = "http";
  if (this->use_tls_ != false) {
    pcVar6 = "https";
  }
  local_4c8 = response;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar6,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)&local_4e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)&local_4c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->secret_,(allocator<char> *)&val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_180,&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (((this->use_tls_ == false) && (pcVar6 = this->proxy_host_, pcVar6 != (char *)0x0)) &&
     (*pcVar6 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,pcVar6,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Action",(allocator<char> *)&local_4e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"GetMetricStatistics",(allocator<char> *)&local_4c0);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  if ((req->namespace_)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"Namespace_",(allocator<char> *)&local_4e8);
    std::__cxx11::string::string((string *)&local_280,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  if ((req->metric_name)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"MetricName",(allocator<char> *)&local_4e8);
    std::__cxx11::string::string((string *)&local_2c0,(string *)&req->metric_name);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  if ((req->start_time)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"StartTime",(allocator<char> *)&local_4e8);
    std::__cxx11::string::string((string *)&local_300,(string *)&req->start_time);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2e0,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  if ((req->end_time)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"EndTime",(allocator<char> *)&local_4e8);
    std::__cxx11::string::string((string *)&local_340,(string *)&req->end_time);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_320,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_320);
  }
  if ((req->interval)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"Interval",(allocator<char> *)&local_4e8);
    std::__cxx11::string::string((string *)&local_380,(string *)&req->interval);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_360,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_360);
  }
  if ((req->dimensions)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,"Dimensions",(allocator<char> *)&local_4e8);
    std::__cxx11::string::string((string *)&local_3c0,(string *)&req->dimensions);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3a0,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3a0);
  }
  if ((req->next_token)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,"NextToken",(allocator<char> *)&local_4e8);
    std::__cxx11::string::string((string *)&local_400,(string *)&req->next_token);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3e0,&local_400);
    std::__cxx11::string::~string((string *)&local_400);
    std::__cxx11::string::~string((string *)&local_3e0);
  }
  if ((req->length)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_420,"Length",(allocator<char> *)&local_4e8);
    std::__cxx11::string::string((string *)&local_440,(string *)&req->length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_420,&local_440);
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)&local_420);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,"RegionId",(allocator<char> *)&local_4e8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_480,this->region_id_,(allocator<char> *)&local_4c0);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_460,&local_480);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_460);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (CmsErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_4e8,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4e8,anon_var_dwarf_157c5a + 9,&local_4e9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_4e8);
        std::__cxx11::string::~string((string *)&local_4e8);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_(&local_4e8,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4e8,anon_var_dwarf_157c5a + 9,&local_4ea);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_4e8);
        std::__cxx11::string::~string((string *)&local_4e8);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_(&local_4e8,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4e8,anon_var_dwarf_157c5a + 9,&local_4eb);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_4e8);
        std::__cxx11::string::~string((string *)&local_4e8);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_(&local_4e8,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4e8,anon_var_dwarf_157c5a + 9,&local_4ec);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_4e8);
        std::__cxx11::string::~string((string *)&local_4e8);
      }
      if (local_4c8 != (CmsGetMetricStatisticsResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"NextToken");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"NextToken");
          IVar3 = Json::Value::asInt(pVVar5);
          local_4c8->next_token = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_(&local_4e8,pVVar5);
          std::__cxx11::string::operator=((string *)&local_4c8->code,(string *)&local_4e8);
          std::__cxx11::string::~string((string *)&local_4e8);
        }
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_(&local_4e8,pVVar5);
          std::__cxx11::string::operator=((string *)&local_4c8->message,(string *)&local_4e8);
          std::__cxx11::string::~string((string *)&local_4e8);
        }
        bVar1 = Json::Value::isMember(&val,"TraceId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"TraceId");
          Json::Value::asString_abi_cxx11_(&local_4e8,pVVar5);
          std::__cxx11::string::operator=((string *)&local_4c8->trace_id,(string *)&local_4e8);
          std::__cxx11::string::~string((string *)&local_4e8);
        }
        bVar1 = Json::Value::isMember(&val,"Datapoints");
        iVar2 = 200;
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Datapoints");
          bVar1 = Json::Value::isMember(pVVar5,"Datapoint");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](&val,"Datapoints");
            pVVar5 = Json::Value::operator[](pVVar5,"Datapoint");
            bVar1 = Json::Value::isArray(pVVar5);
            if (bVar1) {
              for (index = 0; AVar4 = Json::Value::size(pVVar5), index < AVar4; index = index + 1) {
                local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
                local_4c0._M_string_length = 0;
                local_4c0.field_2._M_local_buf[0] = '\0';
                this_01 = Json::Value::operator[](pVVar5,index);
                Json::Value::asString_abi_cxx11_(&local_4e8,this_01);
                std::__cxx11::string::operator=((string *)&local_4c0,(string *)&local_4e8);
                std::__cxx11::string::~string((string *)&local_4e8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_4c8->datapoints,&local_4c0);
                std::__cxx11::string::~string((string *)&local_4c0);
              }
            }
          }
        }
      }
      goto LAB_00132782;
    }
  }
  iVar2 = -1;
  if (error_info != (CmsErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_00132782:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Cms::GetMetricStatistics(const CmsGetMetricStatisticsRequestType& req,
                      CmsGetMetricStatisticsResponseType* response,
                       CmsErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","GetMetricStatistics");
  if(!req.namespace_.empty()) {
    req_rpc->AddRequestQuery("Namespace_", req.namespace_);
  }
  if(!req.metric_name.empty()) {
    req_rpc->AddRequestQuery("MetricName", req.metric_name);
  }
  if(!req.start_time.empty()) {
    req_rpc->AddRequestQuery("StartTime", req.start_time);
  }
  if(!req.end_time.empty()) {
    req_rpc->AddRequestQuery("EndTime", req.end_time);
  }
  if(!req.interval.empty()) {
    req_rpc->AddRequestQuery("Interval", req.interval);
  }
  if(!req.dimensions.empty()) {
    req_rpc->AddRequestQuery("Dimensions", req.dimensions);
  }
  if(!req.next_token.empty()) {
    req_rpc->AddRequestQuery("NextToken", req.next_token);
  }
  if(!req.length.empty()) {
    req_rpc->AddRequestQuery("Length", req.length);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}